

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

void __thiscall
NativeCodeGenerator::CodeGen
          (NativeCodeGenerator *this,PageAllocator *pageAllocator,CodeGenWorkItem *workItem,
          bool foreground)

{
  code *pcVar1;
  LARGE_INTEGER LVar2;
  CodeGenWorkItem *pageAllocator_00;
  bool bVar3;
  CodeGenWorkItemType CVar4;
  ExecutionMode EVar5;
  uint16 uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  LocalFunctionId LVar10;
  ThreadContext *pTVar11;
  UINT_PTR UVar12;
  FunctionBody *pFVar13;
  EntryPointInfo *pEVar14;
  JavascriptMethod p_Var15;
  undefined4 *puVar16;
  ScriptContext *pSVar17;
  undefined8 uVar18;
  CodeGenWorkItemIDL *pCVar19;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc_00;
  FunctionJITTimeDataIDL *pFVar20;
  CodeGenRecyclableData *pCVar21;
  FunctionCodeGenJitTimeData *pFVar22;
  uint *puVar23;
  int **ppiVar24;
  Var pvVar25;
  JITManager *pJVar26;
  undefined4 extraout_var;
  NativeEntryPointData *pNVar27;
  EntryPointInfo *pEVar28;
  JitTransferData *pJVar29;
  HeapAllocator *alloc_01;
  XDataAllocation *this_00;
  FunctionBody *pFVar30;
  DynamicProfileInfo *pDVar31;
  ptrdiff_t pVar32;
  ScriptContext *scriptContext;
  TrackAllocData local_218;
  XDataAllocation *local_1f0;
  XDataAllocation *xdataInfo;
  FunctionEntryPointInfo *funcEP;
  LARGE_INTEGER end_time;
  LARGE_INTEGER freq;
  LARGE_INTEGER start_time;
  JITOutputIDL jitWriteData;
  FunctionEntryPointInfo *funcEPInfo;
  EntryPointInfo *epInfo;
  FunctionCodeGenJitTimeData *codeGenData;
  TrackAllocData local_108;
  FunctionJITTimeDataIDL **local_d0;
  FunctionJITTimeDataIDL **jitData;
  ArenaAllocator alloc;
  int nRegs;
  FunctionBody *body;
  undefined4 uStack_30;
  bool irviewerInstance;
  int v;
  LARGE_INTEGER ctr;
  JsLoopBodyCodeGen *pJStack_20;
  bool foreground_local;
  CodeGenWorkItem *workItem_local;
  PageAllocator *pageAllocator_local;
  NativeCodeGenerator *this_local;
  
  ctr.field_0.HighPart._3_1_ = foreground;
  pJStack_20 = (JsLoopBodyCodeGen *)workItem;
  workItem_local = (CodeGenWorkItem *)pageAllocator;
  pageAllocator_local = (PageAllocator *)this;
  if (foreground) {
    pTVar11 = Js::ScriptContext::GetThreadContext(this->scriptContext);
    ThreadContext::ProbeStackNoDispose(pTVar11,0xc000,this->scriptContext,(PVOID)0x0);
  }
  if (((ctr.field_0.HighPart._3_1_ & 1) == 0) &&
     (bVar3 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,InduceCodeGenFailureFlag),
     bVar3)) {
    if ((CodegenFailureSeed == 0) &&
       (CodegenFailureSeed = (UINT_PTR)DAT_01ea9f24, CodegenFailureSeed == 0)) {
      QueryPerformanceCounter((LARGE_INTEGER *)&stack0xffffffffffffffd0);
      CodegenFailureSeed = (UINT_PTR)(uint)(v ^ uStack_30);
      srand(v ^ uStack_30);
    }
    UVar12 = Math::Rand();
    uVar7 = (uint)(UVar12 % 100);
    if ((int)uVar7 < DAT_01ea9f20) {
      uVar7 = uVar7 % 3;
      if (uVar7 == 0) {
        Js::Throw::OutOfMemory();
      }
      if (uVar7 == 1) {
        uVar18 = __cxa_allocate_exception(1);
        __cxa_throw(uVar18,&Js::StackOverflowException::typeinfo,0);
      }
      if (uVar7 == 2) {
        uVar18 = __cxa_allocate_exception(1);
        __cxa_throw(uVar18,&Js::OperationAbortedException::typeinfo,0);
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x3b0,"(false)","false");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
  }
  CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
  if (CVar4 == JsFunctionType) {
    pFVar13 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
    pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
    p_Var15 = Js::FunctionProxy::GetDirectEntryPoint
                        ((FunctionProxy *)pFVar13,&pEVar14->super_ProxyEntryPointInfo);
    bVar3 = IsThunk(p_Var15);
    if (!bVar3) {
      pFVar13 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
      pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
      p_Var15 = Js::FunctionProxy::GetDirectEntryPoint
                          ((FunctionProxy *)pFVar13,&pEVar14->super_ProxyEntryPointInfo);
      bVar3 = IsAsmJsCodeGenThunk(p_Var15);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                           ,0x3be,
                           "(workItem->Type() != JsFunctionType || irviewerInstance || IsThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())) || IsAsmJsCodeGenThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())))"
                           ,
                           "workItem->Type() != JsFunctionType || irviewerInstance || IsThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())) || IsAsmJsCodeGenThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint()))"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
  }
  uVar7 = (**(pJStack_20->super_CodeGenWorkItem)._vptr_CodeGenWorkItem)();
  InterlockedExchangeAdd<unsigned_int>(&this->byteCodeSizeGenerated,uVar7);
  pFVar13 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
  alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList._4_4_ =
       Js::FunctionBody::GetLocalsCount(pFVar13);
  pSVar17 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar13);
  uVar7 = (*(pSVar17->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((uVar7 & 1) == 0) {
    Memory::ArenaAllocator::ArenaAllocator
              ((ArenaAllocator *)&jitData,L"JitData",(PageAllocator *)workItem_local,
               Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
    pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
    local_d0 = &pCVar19->jitData;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_108,(type_info *)&FunctionJITTimeDataIDL::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
               ,0x3d8);
    alloc_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              &jitData,&local_108);
    pFVar20 = (FunctionJITTimeDataIDL *)
              new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)alloc_00,0x3fb100);
    *local_d0 = pFVar20;
    pCVar21 = CodeGenWorkItem::RecyclableData(&pJStack_20->super_CodeGenWorkItem);
    pFVar22 = Js::CodeGenRecyclableData::JitTimeData(pCVar21);
    pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
    FunctionJITTimeInfo::BuildJITTimeData
              ((ArenaAllocator *)&jitData,pFVar22,(FunctionCodeGenRuntimeData *)0x0,pCVar19->jitData
               ,false,(bool)(ctr.field_0.HighPart._3_1_ & 1));
    uVar6 = Js::FunctionCodeGenJitTimeData::GetProfiledIterations(pFVar22);
    pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
    pCVar19->profiledIterations = uVar6;
    pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
    CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
    if (CVar4 == JsFunctionType) {
      (*local_d0)->callsCountAddress = (long)&pEVar14[1].field_0x1c;
    }
    else {
      puVar23 = Js::FunctionBody::GetJittedLoopIterationsSinceLastBailoutAddress(pEVar14);
      pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
      pCVar19->jittedLoopIterationsSinceLastBailoutAddr = (long)puVar23;
    }
    ppiVar24 = Memory::WriteBarrierPtr::operator_cast_to_int__
                         ((WriteBarrierPtr *)&pFVar22->sharedPropertyGuards);
    (*local_d0)->sharedPropertyGuards = *ppiVar24;
    (*local_d0)->sharedPropGuardCount = pFVar22->sharedPropertyGuardCount;
    jitWriteData.buffer = (NativeDataBuffer *)0x0;
    jitWriteData.equivalentTypeGuardOffsets = (EquivalentTypeGuardOffsets *)0x0;
    jitWriteData.pinnedTypeRefs = (PinnedTypeRefsIDL *)0x0;
    jitWriteData.nativeDataFixupTable = (NativeDataFixupTable *)0x0;
    jitWriteData.typeGuardEntries = (TypeGuardTransferEntryIDL *)0x0;
    jitWriteData.ctorCacheEntries = (CtorCacheTransferEntryIDL **)0x0;
    jitWriteData.codeAddress = 0;
    jitWriteData.thunkAddress = 0;
    jitWriteData.ctorCachesCount = 0;
    jitWriteData.struct_pad_2 = 0;
    jitWriteData.xdataAddr = 0;
    jitWriteData.throwMapCount = 0;
    jitWriteData.inlineeFrameOffsetArrayOffset = 0;
    jitWriteData.inlineeFrameOffsetArrayCount = 0;
    jitWriteData.propertyGuardCount = 0;
    jitWriteData.localVarChangedOffset = 0;
    jitWriteData.frameHeight = 0;
    jitWriteData.codeSize = 0;
    jitWriteData.throwMapOffset = 0;
    jitWriteData.isInPrereservedRegion = '\0';
    jitWriteData.hasBailoutInstr = '\0';
    jitWriteData.hasJittedStackClosure = '\0';
    jitWriteData.struct_pad_0 = '\0';
    jitWriteData.pdataCount = 0;
    jitWriteData.xdataSize = 0;
    jitWriteData.argUsedForBranch = 0;
    jitWriteData.struct_pad_1 = 0;
    jitWriteData.localVarSlotsOffset = 0;
    start_time.QuadPart = 0;
    jitWriteData.disableArrayCheckHoist = '\0';
    jitWriteData.disableAggressiveIntTypeSpec = '\0';
    jitWriteData.disableInlineApply = '\0';
    jitWriteData.disableInlineSpread = '\0';
    jitWriteData.disableStackArgOpt = '\0';
    jitWriteData.disableSwitchOpt = '\0';
    jitWriteData.disableTrackCompoundedIntOverflow = '\0';
    jitWriteData.disableMemOp = '\0';
    pCVar21 = CodeGenWorkItem::RecyclableData(&pJStack_20->super_CodeGenWorkItem);
    pFVar22 = Js::CodeGenRecyclableData::JitTimeData(pCVar21);
    pvVar25 = Js::FunctionCodeGenJitTimeData::GetGlobalThisObject(pFVar22);
    pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
    pCVar19->globalThisAddr = (long)pvVar25;
    freq.QuadPart = 0;
    LogCodeGenStart(&pJStack_20->super_CodeGenWorkItem,&freq);
    LVar2 = freq;
    pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
    pageAllocator_00 = workItem_local;
    pCVar19->startTime = (long)LVar2;
    pCVar19 = CodeGenWorkItem::GetJITData(&pJStack_20->super_CodeGenWorkItem);
    CodeGen(this,(PageAllocator *)pageAllocator_00,pCVar19,(JITOutputIDL *)&start_time.field_0,
            (bool)(ctr.field_0.HighPart._3_1_ & 1),pEVar14);
    pJVar26 = JITManager::GetJITManager();
    bVar3 = JITManager::IsOOPJITEnabled(pJVar26);
    if (bVar3) {
      pFVar30 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
      uVar9 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar30);
      pFVar30 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
      LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar30);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BackEndPhase,uVar9,LVar10);
      if ((bVar3) && ((DAT_01ec73ca & 1) != 0)) {
        QueryPerformanceCounter((LARGE_INTEGER *)&funcEP);
        QueryPerformanceFrequency(&end_time);
        pFVar30 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
        iVar8 = (*(pFVar30->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        Output::Print(L"BackendMarshalOut - function: %s time:%8.6f mSec\r\n",
                      SUB84(((double)((long)funcEP - (long)jitWriteData.equivalentTypeGuardOffsets)
                            * 1000.0) / (double)end_time.QuadPart,0),CONCAT44(extraout_var,iVar8));
        Output::Flush();
      }
    }
    pNVar27 = Js::EntryPointInfo::GetNativeEntryPointData(pEVar14);
    NativeEntryPointData::SetFrameHeight(pNVar27,jitWriteData.localVarSlotsOffset);
    CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
    if (CVar4 == JsFunctionType) {
      xdataInfo = (XDataAllocation *)
                  CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
      *(undefined4 *)
       &(((EntryPointInfo *)((long)xdataInfo + 0x60))->super_ProxyEntryPointInfo).jsMethod =
           jitWriteData._12_4_;
      *(undefined4 *)
       ((long)&(((EntryPointInfo *)((long)xdataInfo + 0x60))->super_ProxyEntryPointInfo).jsMethod +
       4) = jitWriteData._16_4_;
    }
    if (jitWriteData.disableInlineApply != '\0') {
      pEVar28 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
      Js::EntryPointInfo::SetHasJittedStackClosure(pEVar28);
    }
    EVar5 = CodeGenWorkItem::GetJitMode(&pJStack_20->super_CodeGenWorkItem);
    if (EVar5 == SimpleJit) {
      if (jitWriteData.ctorCacheEntries != (CtorCacheTransferEntryIDL **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                           ,0x46d,"(jitWriteData.pinnedTypeRefs == nullptr)",
                           "jitWriteData.pinnedTypeRefs == nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
    else {
      pJVar29 = Js::EntryPointInfo::GetJitTransferData(pEVar14);
      JitTransferData::SetRuntimeTypeRefs
                (pJVar29,(PinnedTypeRefsIDL *)jitWriteData.ctorCacheEntries);
      pJVar29 = Js::EntryPointInfo::GetJitTransferData(pEVar14);
      JitTransferData::SetEquivalentTypeGuardOffsets
                (pJVar29,(EquivalentTypeGuardOffsets *)jitWriteData.buffer);
      pJVar29 = Js::EntryPointInfo::GetJitTransferData(pEVar14);
      JitTransferData::SetTypeGuardTransferData(pJVar29,(JITOutputIDL *)&start_time.field_0);
      if (jitWriteData.typeGuardEntries != (TypeGuardTransferEntryIDL *)0x0) {
        pNVar27 = Js::EntryPointInfo::GetNativeEntryPointData(pEVar14);
        uVar9 = NativeEntryPointData::GetConstructorCacheCount(pNVar27);
        if (uVar9 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                             ,0x466,
                             "(jitWriteData.ctorCacheEntries == nullptr || epInfo->GetNativeEntryPointData()->GetConstructorCacheCount() > 0)"
                             ,
                             "jitWriteData.ctorCacheEntries == nullptr || epInfo->GetNativeEntryPointData()->GetConstructorCacheCount() > 0"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
      }
      pJVar29 = Js::EntryPointInfo::GetJitTransferData(pEVar14);
      JitTransferData::SetCtorCacheTransferData(pJVar29,(JITOutputIDL *)&start_time.field_0);
      pEVar28 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
      pJVar29 = Js::EntryPointInfo::GetJitTransferData(pEVar28);
      JitTransferData::SetIsReady(pJVar29);
    }
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_218,(type_info *)&Memory::XDataAllocation::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
               ,0x472);
    alloc_01 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_218);
    this_00 = (XDataAllocation *)new<Memory::HeapAllocator>(8,alloc_01,0x449f70);
    Memory::XDataAllocation::XDataAllocation(this_00);
    (this_00->super_SecondaryAllocation).address = (BYTE *)jitWriteData._56_8_;
    local_1f0 = this_00;
    Memory::XDataAllocator::Register
              (this_00,jitWriteData.xdataAddr,jitWriteData.localVarChangedOffset);
    pNVar27 = Js::EntryPointInfo::GetNativeEntryPointData(pEVar14);
    NativeEntryPointData::SetXDataInfo(pNVar27,local_1f0);
    if ((DAT_01eafde0 & 1) == 0) {
      if (jitWriteData.codeAddress == 0) {
        pTVar11 = Js::ScriptContext::GetThreadContext(this->scriptContext);
        ThreadContextInfo::SetValidCallTargetForCFG
                  (&pTVar11->super_ThreadContextInfo,(PVOID)jitWriteData.xdataAddr,true);
      }
      else {
        pTVar11 = Js::ScriptContext::GetThreadContext(this->scriptContext);
        ThreadContextInfo::SetValidCallTargetForCFG
                  (&pTVar11->super_ThreadContextInfo,(PVOID)jitWriteData.codeAddress,true);
      }
    }
    CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
    if (CVar4 == JsLoopBodyWorkItemType) {
      if (jitWriteData.codeAddress != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                           ,0x4a6,"(jitWriteData.thunkAddress == __null)",
                           "jitWriteData.thunkAddress == NULL");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      JsLoopBodyCodeGen::SetCodeAddress(pJStack_20,jitWriteData.xdataAddr);
    }
    pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
    Js::EntryPointInfo::SetCodeGenRecorded
              (pEVar14,(JavascriptMethod)jitWriteData.codeAddress,
               (JavascriptMethod)jitWriteData.xdataAddr,jitWriteData._24_8_ & 0xffffffff,this);
    pFVar30 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
    uVar9 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar30);
    pFVar30 = CodeGenWorkItem::GetFunctionBody(&pJStack_20->super_CodeGenWorkItem);
    LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar30);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,EncoderPhase,uVar9,LVar10);
    if ((bVar3) && ((DAT_01ec73ca & 1) != 0)) {
      pJVar26 = JITManager::GetJITManager();
      bVar3 = JITManager::IsOOPJITEnabled(pJVar26);
      if (!bVar3) {
        pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
        Js::EntryPointInfo::DumpNativeOffsetMaps(pEVar14);
        pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
        Js::EntryPointInfo::DumpNativeThrowSpanSequence(pEVar14);
        Output::Flush();
      }
    }
    if (jitWriteData.disableAggressiveIntTypeSpec != '\0') {
      Js::FunctionBody::SetHasBailoutInstrInJittedCode(pFVar13,true);
    }
    if (jitWriteData.disableArrayCheckHoist == '\0') {
      pTVar11 = Js::ScriptContext::GetThreadContext(this->scriptContext);
      ThreadContextInfo::ResetIsAllJITCodeInPreReservedRegion(&pTVar11->super_ThreadContextInfo);
    }
    pFVar13->m_argUsedForBranch = pFVar13->m_argUsedForBranch | jitWriteData._8_2_;
    bVar3 = Js::FunctionBody::HasDynamicProfileInfo(pFVar13);
    if (bVar3) {
      if (start_time.field_0.LowPart._0_1_ != '\0') {
        pDVar31 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar13);
        CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
        Js::DynamicProfileInfo::DisableArrayCheckHoist(pDVar31,CVar4 == JsLoopBodyWorkItemType);
      }
      if (start_time.field_0.LowPart._1_1_ != '\0') {
        pDVar31 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar13);
        CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
        Js::DynamicProfileInfo::DisableAggressiveIntTypeSpec
                  (pDVar31,CVar4 == JsLoopBodyWorkItemType);
      }
      if (start_time.field_0.HighPart._0_1_ != '\0') {
        pDVar31 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar13);
        Js::DynamicProfileInfo::DisableStackArgOpt(pDVar31);
      }
      if (start_time.field_0.HighPart._1_1_ != '\0') {
        pDVar31 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar13);
        Js::DynamicProfileInfo::DisableSwitchOpt(pDVar31);
      }
      if (start_time.field_0.HighPart._2_1_ != '\0') {
        pDVar31 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar13);
        Js::DynamicProfileInfo::DisableTrackCompoundedIntOverflow(pDVar31);
      }
      if (start_time.field_0.HighPart._3_1_ != '\0') {
        pDVar31 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar13);
        Js::DynamicProfileInfo::DisableMemOp(pDVar31);
      }
    }
    if (start_time.field_0.LowPart._2_1_ != '\0') {
      Js::FunctionBody::SetDisableInlineApply(pFVar13,true);
    }
    if (start_time.field_0.LowPart._3_1_ != '\0') {
      Js::FunctionBody::SetDisableInlineSpread(pFVar13,true);
    }
    if ((DAT_01ebb8a3 & 1) != 0) {
      pEVar14 = CodeGenWorkItem::GetEntryPoint(&pJStack_20->super_CodeGenWorkItem);
      pVar32 = Js::EntryPointInfo::GetCodeSize(pEVar14);
      this->scriptContext->codeSize = pVar32 + this->scriptContext->codeSize;
    }
    LogCodeGenDone(&pJStack_20->super_CodeGenWorkItem,&freq);
    pSVar17 = CodeGenWorkItem::GetScriptContext(&pJStack_20->super_CodeGenWorkItem);
    CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
    if (CVar4 == JsFunctionType) {
      uVar7 = (**(pJStack_20->super_CodeGenWorkItem)._vptr_CodeGenWorkItem)();
      InterlockedExchangeAdd<unsigned_int>(&pSVar17->bytecodeJITCount,uVar7);
      InterlockedIncrement<unsigned_int>(&pSVar17->funcJITCount);
    }
    else {
      CVar4 = CodeGenWorkItem::Type(&pJStack_20->super_CodeGenWorkItem);
      if (CVar4 == JsLoopBodyWorkItemType) {
        InterlockedIncrement<unsigned_int>(&pSVar17->loopJITCount);
      }
    }
    Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&jitData);
    return;
  }
  bVar3 = IsBackgroundJIT(this);
  if (!bVar3) {
    pSVar17 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar13);
    bVar3 = Js::ScriptContext::IsActuallyClosed(pSVar17);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0x3c8,
                         "(IsBackgroundJIT() || !body->GetScriptContext()->IsActuallyClosed())",
                         "IsBackgroundJIT() || !body->GetScriptContext()->IsActuallyClosed()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
  }
  uVar18 = __cxa_allocate_exception(1);
  __cxa_throw(uVar18,&Js::OperationAbortedException::typeinfo,0);
}

Assistant:

void
NativeCodeGenerator::CodeGen(PageAllocator * pageAllocator, CodeGenWorkItem* workItem, const bool foreground)
{
    if(foreground)
    {
        // Func::Codegen has a lot of things on the stack, so probe the stack here instead
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackJITCompile);
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (!foreground && Js::Configuration::Global.flags.IsEnabled(Js::InduceCodeGenFailureFlag))
    {
        if (NativeCodeGenerator::CodegenFailureSeed == 0)
        {
            // Initialize the seed
            NativeCodeGenerator::CodegenFailureSeed = Js::Configuration::Global.flags.InduceCodeGenFailureSeed;
            if (NativeCodeGenerator::CodegenFailureSeed == 0)
            {
                LARGE_INTEGER ctr;
                ::QueryPerformanceCounter(&ctr);

                NativeCodeGenerator::CodegenFailureSeed = ctr.HighPart ^ ctr.LowPart;
                srand((uint)NativeCodeGenerator::CodegenFailureSeed);
            }
        }

        int v = Math::Rand() % 100;
        if (v < Js::Configuration::Global.flags.InduceCodeGenFailure)
        {
            switch (v % 3)
            {
            case 0: Js::Throw::OutOfMemory(); break;
            case 1: throw Js::StackOverflowException(); break;
            case 2: throw Js::OperationAbortedException(); break;
            default:
                Assert(false);
            }
        }
    }
#endif

    bool irviewerInstance = false;
#ifdef IR_VIEWER
    irviewerInstance = true;
#endif
    Assert(
        workItem->Type() != JsFunctionType ||
        irviewerInstance ||
        IsThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())) ||
        IsAsmJsCodeGenThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())));

    InterlockedExchangeAdd(&this->byteCodeSizeGenerated, workItem->GetByteCodeCount()); // must be interlocked because this data may be modified in the foreground and background thread concurrently
    Js::FunctionBody* body = workItem->GetFunctionBody();
    int nRegs = body->GetLocalsCount();
    AssertMsg((nRegs + 1) == (int)(SymID)(nRegs + 1), "SymID too small...");

    if (body->GetScriptContext()->IsClosed())
    {
        // Should not be jitting something in the foreground when the script context is actually closed
        Assert(IsBackgroundJIT() || !body->GetScriptContext()->IsActuallyClosed());

        throw Js::OperationAbortedException();
    }

#if ENABLE_OOP_NATIVE_CODEGEN
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        workItem->GetJITData()->nativeDataAddr = (__int3264)workItem->GetEntryPoint()->GetOOPNativeEntryPointData()->GetNativeDataBufferRef();
    }
#endif

    // TODO: oop jit can we be more efficient here?
    ArenaAllocator alloc(_u("JitData"), pageAllocator, Js::Throw::OutOfMemory);

    auto& jitData = workItem->GetJITData()->jitData;
    jitData = AnewStructZ(&alloc, FunctionJITTimeDataIDL);
    auto codeGenData = workItem->RecyclableData()->JitTimeData();
    FunctionJITTimeInfo::BuildJITTimeData(&alloc, codeGenData, nullptr, workItem->GetJITData()->jitData, false, foreground);
    workItem->GetJITData()->profiledIterations = codeGenData->GetProfiledIterations();
    Js::EntryPointInfo * epInfo = workItem->GetEntryPoint();
    if (workItem->Type() == JsFunctionType)
    {
        auto funcEPInfo = (Js::FunctionEntryPointInfo*)epInfo;
        jitData->callsCountAddress = (uintptr_t)&funcEPInfo->callsCount;
    }
    else
    {
        workItem->GetJITData()->jittedLoopIterationsSinceLastBailoutAddr = (intptr_t)Js::FunctionBody::GetJittedLoopIterationsSinceLastBailoutAddress(epInfo);
    }

    jitData->sharedPropertyGuards = codeGenData->sharedPropertyGuards;
    jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;

    JITOutputIDL jitWriteData = {0};

#if !FLOATVAR
    workItem->GetJITData()->xProcNumberPageSegment = scriptContext->GetThreadContext()->GetXProcNumberPageSegmentManager()->GetFreeSegment(&alloc);
#endif
    workItem->GetJITData()->globalThisAddr = (intptr_t)workItem->RecyclableData()->JitTimeData()->GetGlobalThisObject();

    LARGE_INTEGER start_time = { 0 };
    NativeCodeGenerator::LogCodeGenStart(workItem, &start_time);
    workItem->GetJITData()->startTime = (int64)start_time.QuadPart;
    CodeGen(pageAllocator, workItem->GetJITData(), jitWriteData, foreground, epInfo);

    if (JITManager::GetJITManager()->IsOOPJITEnabled() && PHASE_VERBOSE_TRACE(Js::BackEndPhase, workItem->GetFunctionBody()))
    {
        LARGE_INTEGER freq;
        LARGE_INTEGER end_time;
        QueryPerformanceCounter(&end_time);
        QueryPerformanceFrequency(&freq);

        Output::Print(
            _u("BackendMarshalOut - function: %s time:%8.6f mSec\r\n"),
            workItem->GetFunctionBody()->GetDisplayName(),
            (((double)((end_time.QuadPart - jitWriteData.startTime)* (double)1000.0 / (double)freq.QuadPart))) / (1));
        Output::Flush();
    }

    epInfo->GetNativeEntryPointData()->SetFrameHeight(jitWriteData.frameHeight);

    if (workItem->Type() == JsFunctionType)
    {
        Js::FunctionEntryPointInfo * funcEP = (Js::FunctionEntryPointInfo*)workItem->GetEntryPoint();
        funcEP->localVarSlotsOffset = jitWriteData.localVarSlotsOffset;
        funcEP->localVarChangedOffset = jitWriteData.localVarChangedOffset;
    }

    if (jitWriteData.hasJittedStackClosure != FALSE)
    {
        workItem->GetEntryPoint()->SetHasJittedStackClosure();
    }

#if ENABLE_OOP_NATIVE_CODEGEN
#if !FLOATVAR
    if (jitWriteData.numberPageSegments)
    {
        if (jitWriteData.numberPageSegments->pageAddress == 0)
        {
            midl_user_free(jitWriteData.numberPageSegments);
            jitWriteData.numberPageSegments = nullptr;
        }
        else
        {
            // TODO: when codegen fail, need to return the segment as well
            epInfo->GetOOPNativeEntryPointData()->SetNumberPageSegment(jitWriteData.numberPageSegments);
        }
    }
#endif
#endif

#if ENABLE_OOP_NATIVE_CODEGEN
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        if (jitWriteData.nativeDataFixupTable)
        {
            for (unsigned int i = 0; i < jitWriteData.nativeDataFixupTable->count; i++)
            {
                auto& record = jitWriteData.nativeDataFixupTable->fixupRecords[i];
                auto updateList = record.updateList;

                if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                {
                    Output::Print(_u("NativeCodeData Fixup: allocIndex:%d, len:%x, totalOffset:%x, startAddress:%p\n"),
                        record.index, record.length, record.startOffset, jitWriteData.buffer->data + record.startOffset);
                }

                while (updateList)
                {
                    void* addrToFixup = jitWriteData.buffer->data + record.startOffset + updateList->addrOffset;
                    void* targetAddr = jitWriteData.buffer->data + updateList->targetTotalOffset;

                    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                    {
                        Output::Print(_u("\tEntry: +%x %p(%p) ==> %p\n"), updateList->addrOffset, addrToFixup, *(void**)(addrToFixup), targetAddr);
                    }

                    *(void**)(addrToFixup) = targetAddr;
                    auto current = updateList;
                    updateList = updateList->next;
                    midl_user_free(current);
                }
            }
            midl_user_free(jitWriteData.nativeDataFixupTable);
            jitWriteData.nativeDataFixupTable = nullptr;

            // change the address with the fixup information
            epInfo->GetOOPNativeEntryPointData()->SetNativeDataBuffer((char*)jitWriteData.buffer->data);

#if DBG
            if (PHASE_TRACE1(Js::NativeCodeDataPhase))
            {
                Output::Print(_u("NativeCodeData Client Buffer: %p, len: %x\n"), jitWriteData.buffer->data, jitWriteData.buffer->len);
            }
#endif
        }

        if (jitWriteData.throwMapCount > 0)
        {
            Js::ThrowMapEntry * throwMap = (Js::ThrowMapEntry *)(jitWriteData.buffer->data + jitWriteData.throwMapOffset);
            Js::SmallSpanSequenceIter iter;
            for (uint i = 0; i < jitWriteData.throwMapCount; ++i)
            {
                workItem->RecordNativeThrowMap(iter, throwMap[i].nativeBufferOffset, throwMap[i].statementIndex);
            }
        }

        epInfo->GetOOPNativeEntryPointData()->RecordInlineeFrameOffsetsInfo(jitWriteData.inlineeFrameOffsetArrayOffset, jitWriteData.inlineeFrameOffsetArrayCount);
    }
#endif

    if (workItem->GetJitMode() != ExecutionMode::SimpleJit)
    {
        epInfo->GetJitTransferData()->SetRuntimeTypeRefs(jitWriteData.pinnedTypeRefs);
        epInfo->GetJitTransferData()->SetEquivalentTypeGuardOffsets(jitWriteData.equivalentTypeGuardOffsets);
        epInfo->GetJitTransferData()->SetTypeGuardTransferData(&jitWriteData);

        Assert(jitWriteData.ctorCacheEntries == nullptr || epInfo->GetNativeEntryPointData()->GetConstructorCacheCount() > 0);
        epInfo->GetJitTransferData()->SetCtorCacheTransferData(&jitWriteData);

        workItem->GetEntryPoint()->GetJitTransferData()->SetIsReady();
    }
    else
    {
        Assert(jitWriteData.pinnedTypeRefs == nullptr);
    }


#if defined(TARGET_64)
    XDataAllocation * xdataInfo = HeapNewZ(XDataAllocation);
    xdataInfo->address = (byte*)jitWriteData.xdataAddr;
    XDataAllocator::Register(xdataInfo, jitWriteData.codeAddress, jitWriteData.codeSize);
    epInfo->GetNativeEntryPointData()->SetXDataInfo(xdataInfo);
#endif


#if defined(_M_ARM)
    // for in-proc jit we do registration in encoder
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        XDataAllocation * xdataInfo = HeapNewZ(XDataAllocation);
        xdataInfo->pdataCount = jitWriteData.pdataCount;
        xdataInfo->xdataSize = jitWriteData.xdataSize;
        if (jitWriteData.buffer)
        {
            xdataInfo->address = jitWriteData.buffer->data + jitWriteData.xdataOffset;
            for (ushort i = 0; i < xdataInfo->pdataCount; ++i)
            {
                RUNTIME_FUNCTION *function = xdataInfo->GetPdataArray() + i;
                // if flag is 0, then we have separate .xdata, for which we need to fixup the address
                if (function->Flag == 0)
                {
                    // UnwindData was set on server as the offset from the beginning of xdata buffer
                    function->UnwindData = (DWORD)(xdataInfo->address + function->UnwindData);
                    Assert(((DWORD)function->UnwindData & 0x3) == 0); // 4 byte aligned
                }
            }
        }
        else
        {
            xdataInfo->address = nullptr;
        }
        // unmask thumb mode from code address
        XDataAllocator::Register(xdataInfo, jitWriteData.codeAddress & ~0x1, jitWriteData.codeSize);
        epInfo->GetNativeEntryPointData()->SetXDataInfo(xdataInfo);
    }
#endif

    if (!CONFIG_FLAG(OOPCFGRegistration))
    {
        if (jitWriteData.thunkAddress)
        {
            scriptContext->GetThreadContext()->SetValidCallTargetForCFG((PVOID)jitWriteData.thunkAddress);
        }
        else
        {
            scriptContext->GetThreadContext()->SetValidCallTargetForCFG((PVOID)jitWriteData.codeAddress);
        }
    }
    if (workItem->Type() == JsLoopBodyWorkItemType)
    {
        Assert(jitWriteData.thunkAddress == NULL);
        ((JsLoopBodyCodeGen*)workItem)->SetCodeAddress(jitWriteData.codeAddress);
    }

    workItem->GetEntryPoint()->SetCodeGenRecorded((Js::JavascriptMethod)jitWriteData.thunkAddress, (Js::JavascriptMethod)jitWriteData.codeAddress, jitWriteData.codeSize, (void *)this);

#if DBG_DUMP
    if (PHASE_DUMP(Js::EncoderPhase, workItem->GetFunctionBody()) && Js::Configuration::Global.flags.Verbose && !JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        workItem->GetEntryPoint()->DumpNativeOffsetMaps();
        workItem->GetEntryPoint()->DumpNativeThrowSpanSequence();
        Output::Flush();
    }
#endif

    if (jitWriteData.hasBailoutInstr != FALSE)
    {
        body->SetHasBailoutInstrInJittedCode(true);
    }
    if (!jitWriteData.isInPrereservedRegion)
    {
        scriptContext->GetThreadContext()->ResetIsAllJITCodeInPreReservedRegion();
    }

    body->m_argUsedForBranch |= jitWriteData.argUsedForBranch;

    if (body->HasDynamicProfileInfo())
    {
        if (jitWriteData.disableArrayCheckHoist)
        {
            body->GetAnyDynamicProfileInfo()->DisableArrayCheckHoist(workItem->Type() == JsLoopBodyWorkItemType);
        }
        if (jitWriteData.disableAggressiveIntTypeSpec)
        {
            body->GetAnyDynamicProfileInfo()->DisableAggressiveIntTypeSpec(workItem->Type() == JsLoopBodyWorkItemType);
        }
        if (jitWriteData.disableStackArgOpt)
        {
            body->GetAnyDynamicProfileInfo()->DisableStackArgOpt();
        }
        if (jitWriteData.disableSwitchOpt)
        {
            body->GetAnyDynamicProfileInfo()->DisableSwitchOpt();
        }
        if (jitWriteData.disableTrackCompoundedIntOverflow)
        {
            body->GetAnyDynamicProfileInfo()->DisableTrackCompoundedIntOverflow();
        }
        if (jitWriteData.disableMemOp)
        {
            body->GetAnyDynamicProfileInfo()->DisableMemOp();
        }
    }

    if (jitWriteData.disableInlineApply)
    {
        body->SetDisableInlineApply(true);
    }
    if (jitWriteData.disableInlineSpread)
    {
        body->SetDisableInlineSpread(true);
    }

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
    if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
    {
        scriptContext->codeSize += workItem->GetEntryPoint()->GetCodeSize();
    }
#endif

    NativeCodeGenerator::LogCodeGenDone(workItem, &start_time);

#ifdef BGJIT_STATS
    // Must be interlocked because the following data may be modified from the background and foreground threads concurrently
    Js::ScriptContext *scriptContext = workItem->GetScriptContext();
    if (workItem->Type() == JsFunctionType)
    {
        InterlockedExchangeAdd(&scriptContext->bytecodeJITCount, workItem->GetByteCodeCount());
        InterlockedIncrement(&scriptContext->funcJITCount);
    }
    else if(workItem->Type() == JsLoopBodyWorkItemType)
    {
        InterlockedIncrement(&scriptContext->loopJITCount);
    }
#endif
}